

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int big2_attributeValueTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  char cVar5;
  long lVar6;
  bool bVar7;
  
  pbVar4 = (byte *)ptr;
  if (ptr == end) {
    return -4;
  }
  do {
    bVar1 = *pbVar4;
    if (bVar1 < 0xdc) {
      cVar5 = '\a';
      if (3 < bVar1 - 0xd8) {
        if (bVar1 == 0) {
          cVar5 = *(char *)((long)enc[1].scanners + (ulong)pbVar4[1]);
        }
        else {
LAB_004e6453:
          cVar5 = '\x1d';
        }
      }
    }
    else if (bVar1 - 0xdc < 4) {
      cVar5 = '\b';
    }
    else {
      if ((bVar1 != 0xff) || (pbVar4[1] < 0xfe)) goto LAB_004e6453;
      cVar5 = '\0';
    }
    lVar6 = 2;
    switch(cVar5) {
    case '\x02':
      *nextTokPtr = (char *)pbVar4;
      return 0;
    case '\x03':
      if (pbVar4 == (byte *)ptr) {
        iVar2 = big2_scanRef(enc,(char *)(pbVar4 + 2),end,nextTokPtr);
        return iVar2;
      }
      goto LAB_004e6496;
    case '\x04':
    case '\x05':
    case '\b':
      break;
    case '\x06':
      lVar6 = 3;
      break;
    case '\a':
      lVar6 = 4;
      break;
    case '\t':
      if (pbVar4 == (byte *)ptr) {
        pbVar3 = pbVar4 + 2;
        if (pbVar3 != (byte *)end) {
          if (*pbVar3 == 0) {
            bVar7 = *(char *)((long)enc[1].scanners + (ulong)pbVar4[3]) == '\n';
          }
          else {
            bVar7 = false;
          }
          if (bVar7) {
            pbVar3 = pbVar4 + 4;
          }
          *nextTokPtr = (char *)pbVar3;
          return 7;
        }
        return -3;
      }
      goto LAB_004e6496;
    case '\n':
      if (pbVar4 == (byte *)ptr) {
        *nextTokPtr = (char *)(pbVar4 + 2);
        return 7;
      }
      goto LAB_004e6496;
    default:
      if (cVar5 == '\x15') {
        if (pbVar4 == (byte *)ptr) {
          *nextTokPtr = (char *)(pbVar4 + 2);
          return 0x27;
        }
        goto LAB_004e6496;
      }
    }
    pbVar4 = pbVar4 + lVar6;
  } while (pbVar4 != (byte *)end);
LAB_004e6496:
  *nextTokPtr = (char *)pbVar4;
  return 6;
}

Assistant:

static
int PREFIX(attributeValueTok)(const ENCODING *enc, const char *ptr, const char *end,
                              const char **nextTokPtr)
{
  const char *start;
  if (ptr == end)
    return XML_TOK_NONE;
  start = ptr;
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: ptr += n; break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_AMP:
      if (ptr == start)
        return PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    case BT_LT:
      /* this is for inside entity references */
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    case BT_LF:
      if (ptr == start) {
        *nextTokPtr = ptr + MINBPC(enc);
        return XML_TOK_DATA_NEWLINE;
      }
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    case BT_CR:
      if (ptr == start) {
        ptr += MINBPC(enc);
        if (ptr == end)
          return XML_TOK_TRAILING_CR;
        if (BYTE_TYPE(enc, ptr) == BT_LF)
          ptr += MINBPC(enc);
        *nextTokPtr = ptr;
        return XML_TOK_DATA_NEWLINE;
      }
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    case BT_S:
      if (ptr == start) {
        *nextTokPtr = ptr + MINBPC(enc);
        return XML_TOK_ATTRIBUTE_VALUE_S;
      }
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}